

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_node(FILE *file,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,REF_NODE ref_node,
             REF_LONG nnode)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  int dest;
  int iVar3;
  REF_INT RVar4;
  uint uVar5;
  REF_STATUS RVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  REF_MPI pRVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  REF_DBL *pRVar20;
  REF_DBL dbl;
  REF_INT n;
  REF_INT new_node;
  REF_LONG id;
  REF_DBL local_80;
  uint local_78;
  int local_74;
  FILE *local_70;
  REF_MPI local_68;
  REF_NODE local_60;
  REF_INT local_58;
  REF_BOOL local_54;
  long local_50;
  long local_48;
  void *local_40;
  REF_LONG local_38;
  
  pRVar13 = ref_node->ref_mpi;
  local_58 = version;
  local_54 = twod;
  uVar5 = ref_node_initialize_n_global(ref_node,nnode);
  if (uVar5 == 0) {
    local_70 = (FILE *)file;
    local_68 = pRVar13;
    local_60 = ref_node;
    if (pRVar13->id == 0) {
      local_48 = nnode + -1;
      lVar19 = 0;
      local_50 = nnode;
      do {
        pRVar1 = local_60;
        uVar5 = pRVar13->n;
        uVar17 = (ulong)uVar5;
        lVar14 = (long)(int)uVar5;
        lVar15 = local_50 - (local_48 / lVar14) * lVar14;
        if (lVar15 < 2) {
          lVar14 = ((local_48 + lVar14) / lVar14) * lVar15 + (1 - lVar15) * (local_48 / lVar14);
        }
        else {
          lVar14 = (local_48 + lVar14) / lVar14;
        }
        if (lVar14 <= lVar19) {
          if ((int)uVar5 < 2) {
            return 0;
          }
          local_60 = (REF_NODE)0x1;
          lVar14 = local_48;
          lVar19 = local_50;
          goto LAB_0013e973;
        }
        uVar5 = ref_node_add(local_60,lVar19,&local_74);
        pRVar13 = local_68;
        if (uVar5 != 0) {
          pcVar18 = "new_node";
          uVar12 = 0x52;
          goto LAB_0013e69b;
        }
        pRVar1->part[local_74] = local_68->id;
        sVar8 = fread(&local_80,8,1,local_70);
        RVar4 = local_58;
        if (sVar8 != 1) {
          pcVar18 = "x";
          uVar12 = 0x54;
LAB_0013ee81:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar12,"ref_part_node",pcVar18);
          return 1;
        }
        if (swap_endian != 0) {
          local_80 = (REF_DBL)((ulong)local_80 >> 0x38 |
                               ((ulong)local_80 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_80 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_80 & 0xff00000000) >> 8 |
                               ((ulong)local_80 & 0xff000000) << 8 |
                               ((ulong)local_80 & 0xff0000) << 0x18 |
                               ((ulong)local_80 & 0xff00) << 0x28 | (long)local_80 << 0x38);
        }
        local_60->real[(long)local_74 * 0xf] = local_80;
        sVar8 = fread(&local_80,8,1,local_70);
        if (sVar8 != 1) {
          pcVar18 = "y";
          uVar12 = 0x57;
          goto LAB_0013ee81;
        }
        if (swap_endian != 0) {
          local_80 = (REF_DBL)((ulong)local_80 >> 0x38 |
                               ((ulong)local_80 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_80 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_80 & 0xff00000000) >> 8 |
                               ((ulong)local_80 & 0xff000000) << 8 |
                               ((ulong)local_80 & 0xff0000) << 0x18 |
                               ((ulong)local_80 & 0xff00) << 0x28 | (long)local_80 << 0x38);
        }
        local_60->real[(long)local_74 * 0xf + 1] = local_80;
        if (local_54 == 0) {
          sVar8 = fread(&local_80,8,1,local_70);
          if (sVar8 != 1) {
            pcVar18 = "z";
            uVar12 = 0x5b;
            goto LAB_0013ee81;
          }
          if (swap_endian != 0) {
            local_80 = (REF_DBL)((ulong)local_80 >> 0x38 |
                                 ((ulong)local_80 & 0xff000000000000) >> 0x28 |
                                 ((ulong)local_80 & 0xff0000000000) >> 0x18 |
                                 ((ulong)local_80 & 0xff00000000) >> 8 |
                                 ((ulong)local_80 & 0xff000000) << 8 |
                                 ((ulong)local_80 & 0xff0000) << 0x18 |
                                 ((ulong)local_80 & 0xff00) << 0x28 | (long)local_80 << 0x38);
          }
        }
        else {
          local_80 = 0.0;
        }
        local_60->real[(long)local_74 * 0xf + 2] = local_80;
        if ((0 < RVar4) &&
           (RVar6 = ref_part_meshb_long((FILE *)local_70,RVar4,&local_38), RVar6 != 0))
        goto LAB_0013ec55;
        lVar19 = lVar19 + 1;
      } while( true );
    }
    uVar5 = ref_mpi_scatter_recv(pRVar13,&local_78,1,1);
    if (uVar5 == 0) {
      if ((int)local_78 < 1) {
        return 0;
      }
      iVar7 = local_78 * 3;
      pvVar9 = malloc((ulong)local_78 * 0x18);
      pRVar13 = local_68;
      if (pvVar9 == (void *)0x0) {
        uVar12 = 0x82;
LAB_0013ec44:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar12,"ref_part_node","malloc xyz of REF_DBL NULL");
        return 2;
      }
      uVar5 = ref_mpi_scatter_recv(local_68,pvVar9,iVar7,3);
      pRVar1 = local_60;
      if (uVar5 == 0) {
        local_70 = (FILE *)pvVar9;
        local_50 = nnode;
        if (0 < (int)local_78) {
          lVar19 = nnode + -1;
          iVar7 = pRVar13->id;
          pRVar20 = (REF_DBL *)((long)pvVar9 + 0x10);
          lVar14 = 0;
          do {
            lVar15 = (long)iVar7;
            lVar11 = (long)pRVar13->n;
            lVar16 = local_50 - (lVar19 / lVar11) * lVar11;
            if (lVar15 < lVar16) {
              lVar15 = ((lVar19 + lVar11) / lVar11) * lVar15;
            }
            else {
              lVar15 = ((lVar19 + lVar11) / lVar11) * lVar16 + (lVar15 - lVar16) * (lVar19 / lVar11)
              ;
            }
            uVar5 = ref_node_add(pRVar1,lVar15 + lVar14,&local_74);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x89,"ref_part_node",(ulong)uVar5,"new_node");
              return uVar5;
            }
            iVar7 = local_68->id;
            pRVar1->part[local_74] = iVar7;
            pRVar2 = pRVar1->real;
            lVar15 = (long)local_74;
            pRVar2[lVar15 * 0xf] = pRVar20[-2];
            pRVar2[lVar15 * 0xf + 1] = pRVar20[-1];
            pRVar2[lVar15 * 0xf + 2] = *pRVar20;
            lVar14 = lVar14 + 1;
            pRVar20 = pRVar20 + 3;
            pRVar13 = local_68;
          } while (lVar14 < (int)local_78);
        }
        free(local_70);
        return 0;
      }
      pcVar18 = "recv";
      uVar12 = 0x83;
    }
    else {
      pcVar18 = "recv";
      uVar12 = 0x80;
    }
  }
  else {
    pcVar18 = "init nnodesg";
    uVar12 = 0x4c;
  }
LAB_0013e69b:
  uVar17 = (ulong)uVar5;
LAB_0013e69e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar12,
         "ref_part_node",uVar17,pcVar18);
  return uVar5;
LAB_0013e973:
  pRVar1 = (REF_NODE)((long)&local_60->n + 1);
  lVar15 = (long)(int)uVar17;
  lVar11 = lVar19 - (lVar14 / lVar15) * lVar15;
  iVar3 = (int)lVar11;
  iVar7 = (int)(lVar14 / lVar15);
  if ((long)pRVar1 < lVar11) {
    iVar10 = (int)((lVar14 + lVar15) / lVar15) * (int)pRVar1;
  }
  else {
    iVar10 = (int)((lVar14 + lVar15) / lVar15) * iVar3 + ((int)pRVar1 - iVar3) * iVar7;
  }
  dest = (int)local_60;
  if ((long)local_60 < lVar11) {
    iVar7 = (int)((lVar14 + lVar15) / lVar15) * dest;
  }
  else {
    iVar7 = (int)((lVar14 + lVar15) / lVar15) * iVar3 + (dest - iVar3) * iVar7;
  }
  local_78 = iVar10 - iVar7;
  local_60 = pRVar1;
  uVar5 = ref_mpi_scatter_send(local_68,&local_78,1,1,dest);
  if (uVar5 != 0) {
    pcVar18 = "send";
    uVar12 = 0x66;
    goto LAB_0013e69b;
  }
  if (0 < (int)local_78) {
    pvVar9 = malloc((ulong)local_78 * 0x18);
    RVar4 = local_58;
    if (pvVar9 == (void *)0x0) {
      uVar12 = 0x68;
      goto LAB_0013ec44;
    }
    pRVar20 = (REF_DBL *)((long)pvVar9 + 0x10);
    lVar19 = 0;
    local_40 = pvVar9;
    do {
      sVar8 = fread(&local_80,8,1,local_70);
      if (sVar8 != 1) {
        pcVar18 = "x";
        uVar12 = 0x6a;
        goto LAB_0013ee81;
      }
      if (swap_endian != 0) {
        local_80 = (REF_DBL)((ulong)local_80 >> 0x38 | ((ulong)local_80 & 0xff000000000000) >> 0x28
                             | ((ulong)local_80 & 0xff0000000000) >> 0x18 |
                             ((ulong)local_80 & 0xff00000000) >> 8 |
                             ((ulong)local_80 & 0xff000000) << 8 |
                             ((ulong)local_80 & 0xff0000) << 0x18 |
                             ((ulong)local_80 & 0xff00) << 0x28 | (long)local_80 << 0x38);
      }
      pRVar20[-2] = local_80;
      sVar8 = fread(&local_80,8,1,local_70);
      if (sVar8 != 1) {
        pcVar18 = "y";
        uVar12 = 0x6d;
        goto LAB_0013ee81;
      }
      if (swap_endian != 0) {
        local_80 = (REF_DBL)((ulong)local_80 >> 0x38 | ((ulong)local_80 & 0xff000000000000) >> 0x28
                             | ((ulong)local_80 & 0xff0000000000) >> 0x18 |
                             ((ulong)local_80 & 0xff00000000) >> 8 |
                             ((ulong)local_80 & 0xff000000) << 8 |
                             ((ulong)local_80 & 0xff0000) << 0x18 |
                             ((ulong)local_80 & 0xff00) << 0x28 | (long)local_80 << 0x38);
      }
      pRVar20[-1] = local_80;
      if (local_54 == 0) {
        sVar8 = fread(&local_80,8,1,local_70);
        if (sVar8 != 1) {
          pcVar18 = "z";
          uVar12 = 0x71;
          goto LAB_0013ee81;
        }
        if (swap_endian != 0) {
          local_80 = (REF_DBL)((ulong)local_80 >> 0x38 |
                               ((ulong)local_80 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_80 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_80 & 0xff00000000) >> 8 |
                               ((ulong)local_80 & 0xff000000) << 8 |
                               ((ulong)local_80 & 0xff0000) << 0x18 |
                               ((ulong)local_80 & 0xff00) << 0x28 | (long)local_80 << 0x38);
        }
      }
      else {
        local_80 = 0.0;
      }
      *pRVar20 = local_80;
      if ((0 < RVar4) && (RVar6 = ref_part_meshb_long((FILE *)local_70,RVar4,&local_38), RVar6 != 0)
         ) {
        uVar12 = 0x78;
        goto LAB_0013ec7b;
      }
      pvVar9 = local_40;
      lVar19 = lVar19 + 1;
      pRVar20 = pRVar20 + 3;
    } while (lVar19 < (int)local_78);
    uVar5 = ref_mpi_scatter_send(local_68,local_40,local_78 * 3,3,dest);
    lVar14 = local_48;
    lVar19 = local_50;
    if (uVar5 != 0) {
      pcVar18 = "send";
      uVar12 = 0x7b;
      goto LAB_0013e69b;
    }
    free(pvVar9);
  }
  uVar17 = (ulong)local_68->n;
  if ((long)uVar17 <= (long)local_60) {
    return 0;
  }
  goto LAB_0013e973;
LAB_0013ec55:
  uVar12 = 0x61;
LAB_0013ec7b:
  uVar5 = 1;
  pcVar18 = "nnode";
  uVar17 = 1;
  goto LAB_0013e69e;
}

Assistant:

REF_FCN static REF_STATUS ref_part_node(FILE *file, REF_BOOL swap_endian,
                                        REF_INT version, REF_BOOL twod,
                                        REF_NODE ref_node, REF_LONG nnode) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, new_node;
  REF_INT part;
  REF_INT n;
  REF_LONG id;
  REF_DBL dbl;
  REF_DBL *xyz;

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init nnodesg");

  if (ref_mpi_once(ref_mpi)) {
    part = 0;
    for (node = 0; node < ref_part_first(nnode, ref_mpi_n(ref_mpi), 1);
         node++) {
      RSS(ref_node_add(ref_node, node, &new_node), "new_node");
      ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 0, new_node) = dbl;
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 1, new_node) = dbl;
      if (!twod) {
        RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
        if (swap_endian) SWAP_DBL(dbl);
      } else {
        dbl = 0.0;
      }
      ref_node_xyz(ref_node, 2, new_node) = dbl;
      if (version > 0) RSS(ref_part_meshb_long(file, version, &id), "nnode");
    }
    each_ref_mpi_worker(ref_mpi, part) {
      n = (REF_INT)(ref_part_first(nnode, ref_mpi_n(ref_mpi), part + 1) -
                    ref_part_first(nnode, ref_mpi_n(ref_mpi), part));
      RSS(ref_mpi_scatter_send(ref_mpi, &n, 1, REF_INT_TYPE, part), "send");
      if (n > 0) {
        ref_malloc(xyz, 3 * n, REF_DBL);
        for (node = 0; node < n; node++) {
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[0 + 3 * node] = dbl;
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[1 + 3 * node] = dbl;
          if (!twod) {
            RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
            if (swap_endian) SWAP_DBL(dbl);
          } else {
            dbl = 0.0;
          }
          xyz[2 + 3 * node] = dbl;
          if (version > 0)
            RSS(ref_part_meshb_long(file, version, &id), "nnode");
        }
        RSS(ref_mpi_scatter_send(ref_mpi, xyz, 3 * n, REF_DBL_TYPE, part),
            "send");
        free(xyz);
      }
    }
  } else {
    RSS(ref_mpi_scatter_recv(ref_mpi, &n, 1, REF_INT_TYPE), "recv");
    if (n > 0) {
      ref_malloc(xyz, 3 * n, REF_DBL);
      RSS(ref_mpi_scatter_recv(ref_mpi, xyz, 3 * n, REF_DBL_TYPE), "recv");
      for (node = 0; node < n; node++) {
        RSS(ref_node_add(ref_node,
                         node + ref_part_first(nnode, ref_mpi_n(ref_mpi),
                                               ref_mpi_rank(ref_mpi)),
                         &new_node),
            "new_node");
        ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
        ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
      }
      free(xyz);
    }
  }

  return REF_SUCCESS;
}